

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O1

bool __thiscall lattice::supercell::within_supercell(supercell *this,offset_t *cell)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>
  p;
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_58;
  XprType local_40;
  
  local_40.m_lhs = &this->rs_;
  if (this->dim_ == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    uVar3 = 0;
    local_40.m_rhs.m_xpr = cell;
    do {
      Eigen::internal::
      product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
      ::product_evaluator(&local_58,&local_40);
      dVar1 = *(double *)
               ((long)local_58.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      .m_d.data + uVar3 * 8);
      free(local_58.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (dVar1 < -1e-08) {
LAB_00105da5:
        bVar2 = false;
      }
      else {
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator(&local_58,&local_40);
        dVar1 = *(double *)
                 ((long)local_58.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        .m_d.data + uVar3 * 8);
        free(local_58.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        if (0.99999999 < dVar1) goto LAB_00105da5;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->dim_);
  }
  return bVar2;
}

Assistant:

bool within_supercell(const offset_t& cell) const {
    const double eps = 1.0e-8;
    auto p = rs_ * cell.cast<double>();
    bool res = true;
    for (std::size_t m = 0; m < dim_; ++m) {
      if (p(m) < -eps || p(m) > (1.0 - eps)) res = false;
    }
    return res;
  }